

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

Sequences * __thiscall
wasm::Outlining::makeSequences
          (Sequences *__return_storage_ptr__,Outlining *this,Module *module,Substrings *substrings,
          HashStringifyWalker *stringify)

{
  uint32_t idx;
  pointer pRVar1;
  uint32_t *puVar2;
  iterator __position;
  vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>> *this_00;
  RepeatedSubstring *substring;
  pointer substring_00;
  uint32_t *puVar3;
  Name NVar4;
  pair<unsigned_int,_wasm::Name> local_a0;
  undefined1 auStack_88 [8];
  OutliningSequence seq;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  substring_00 = (substrings->
                 super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (substrings->
           super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (substring_00 != pRVar1) {
    do {
      NVar4 = addOutlinedFunction(this,module,substring_00,&stringify->exprs);
      seq._24_8_ = NVar4.super_IString.str._M_len;
      puVar2 = (substring_00->StartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar3 = (substring_00->StartIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
        idx = *puVar3;
        HashStringifyWalker::makeRelative(&local_a0,stringify,idx);
        auStack_88._4_4_ = substring_00->Length + local_a0.first;
        seq.func.super_IString.str._M_str._0_1_ =
             ((stringify->exprs).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start[(idx + substring_00->Length) - 1]->type).id == 1;
        auStack_88._0_4_ = local_a0.first;
        seq._0_8_ = seq._24_8_;
        seq.func.super_IString.str._M_len = (size_t)NVar4.super_IString.str._M_str;
        this_00 = (vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>> *)
                  std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)__return_storage_ptr__,&local_a0.second);
        __position._M_current = *(OutliningSequence **)(this_00 + 8);
        if (__position._M_current == *(OutliningSequence **)(this_00 + 0x10)) {
          std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>::
          _M_realloc_insert<wasm::OutliningSequence_const&>
                    (this_00,__position,(OutliningSequence *)auStack_88);
        }
        else {
          ((__position._M_current)->func).super_IString.str._M_str =
               (char *)seq.func.super_IString.str._M_len;
          *(ulong *)&(__position._M_current)->endsTypeUnreachable =
               CONCAT71(seq.func.super_IString.str._M_str._1_7_,
                        seq.func.super_IString.str._M_str._0_1_);
          (__position._M_current)->startIdx = auStack_88._0_4_;
          (__position._M_current)->endIdx = auStack_88._4_4_;
          ((__position._M_current)->func).super_IString.str._M_len = seq._0_8_;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x20;
        }
      }
      substring_00 = substring_00 + 1;
    } while (substring_00 != pRVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Sequences makeSequences(Module* module,
                          const Substrings& substrings,
                          const HashStringifyWalker& stringify) {
    Sequences seqByFunc;
    for (auto& substring : substrings) {
      auto func = addOutlinedFunction(module, substring, stringify.exprs);
      for (auto seqIdx : substring.StartIndices) {
        // seqIdx is relative to the entire program; making the idx of the
        // sequence relative to its function is better for outlining because we
        // walk functions.
        auto [relativeIdx, existingFunc] = stringify.makeRelative(seqIdx);
        auto seq = OutliningSequence(
          relativeIdx,
          relativeIdx + substring.Length,
          func,
          stringify.exprs[seqIdx + substring.Length - 1]->type ==
            Type::unreachable
#if OUTLINING_DEBUG
          ,
          seqIdx
#endif
        );
        seqByFunc[existingFunc].push_back(seq);
      }
    }
    return seqByFunc;
  }